

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.c
# Opt level: O0

uint32 leaf_mean_vars(dtree_node_t *node,pset_t *pset,float32 ****means,float32 ****vars,
                     uint32 *node_id,uint32 n_state,uint32 n_stream,uint32 *veclen,uint32 off)

{
  uint32 off_00;
  uint local_48;
  uint local_44;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 n_state_local;
  uint32 *node_id_local;
  float32 ****vars_local;
  float32 ****means_local;
  pset_t *pset_local;
  dtree_node_t *node_local;
  
  if ((node->y == (dtree_node_str *)0x0) && (node->n == (dtree_node_str *)0x0)) {
    node_id[off] = node->node_id;
    for (k = 0; k < n_state; k = k + 1) {
      for (local_44 = 0; local_44 < n_stream; local_44 = local_44 + 1) {
        for (local_48 = 0; local_48 < veclen[local_44]; local_48 = local_48 + 1) {
          means[off][k][local_44][local_48] = node->means[k][local_44][local_48];
          vars[off][k][local_44][local_48] = node->vars[k][local_44][local_48];
        }
      }
    }
    node_local._4_4_ = off + 1;
  }
  else {
    off_00 = leaf_mean_vars(node->y,pset,means,vars,node_id,n_state,n_stream,veclen,off);
    node_local._4_4_ =
         leaf_mean_vars(node->n,pset,means,vars,node_id,n_state,n_stream,veclen,off_00);
  }
  return node_local._4_4_;
}

Assistant:

uint32
leaf_mean_vars(dtree_node_t *node,
	       pset_t *pset,
	       float32 ****means,
	       float32 ****vars,
	       uint32 *node_id,
	       uint32 n_state,
	       uint32 n_stream,
	       uint32 *veclen,
	       uint32 off)
{
    uint32 i, j, k;

    if (IS_LEAF(node)) {
	node_id[off] = node->node_id;

	for (i = 0; i < n_state; i++) {
	    for (j = 0; j < n_stream; j++) {
		for (k = 0; k < veclen[j]; k++) {
                    means[off][i][j][k] = node->means[i][j][k];
                    vars[off][i][j][k] = node->vars[i][j][k];
		}
	    }
	}

	return ++off;
    }
    else {
	off = leaf_mean_vars(node->y,
			pset,
			means,
                        vars,
			node_id,
			n_state,
			n_stream,
			veclen,
			off);
	off = leaf_mean_vars(node->n,
			pset,
			means,
                        vars,
			node_id,
			n_state,
			n_stream,
			veclen,
			off);
	return off;
    }
}